

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::ShouldShard
               (char *total_shards_env,char *shard_index_env,bool in_subprocess_for_death_test)

{
  uint uVar1;
  uint uVar2;
  undefined7 in_register_00000011;
  ostream *poVar3;
  Message msg;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000011,in_subprocess_for_death_test) == 0) {
    uVar1 = Int32FromEnvOrDie(total_shards_env,-1);
    uVar2 = Int32FromEnvOrDie(shard_index_env,-1);
    if ((uVar2 & uVar1) != 0xffffffff) {
      if (uVar2 == 0xffffffff || uVar1 != 0xffffffff) {
        if (uVar1 == 0xffffffff || uVar2 != 0xffffffff) {
          if ((-1 < (int)uVar2) && ((int)uVar2 < (int)uVar1)) {
            return 1 < (int)uVar1;
          }
          Message::Message((Message *)&local_38);
          poVar3 = (ostream *)(local_38._M_dataplus._M_p + 0x10);
          std::operator<<(poVar3,"Invalid environment variables: we require 0 <= ");
          std::operator<<(poVar3,"GTEST_SHARD_INDEX");
          std::operator<<(poVar3," < ");
          std::operator<<(poVar3,"GTEST_TOTAL_SHARDS");
          std::operator<<(poVar3,", but you have ");
          std::operator<<(poVar3,"GTEST_SHARD_INDEX");
          std::operator<<(poVar3,"=");
          std::ostream::operator<<(poVar3,uVar2);
          std::operator<<(poVar3,", ");
          std::operator<<(poVar3,"GTEST_TOTAL_SHARDS");
          std::operator<<(poVar3,"=");
          std::ostream::operator<<(poVar3,uVar1);
          std::operator<<(poVar3,".\n");
          Message::Message(&msg,(Message *)&local_38);
          if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
          }
          StringStreamToString
                    (&local_38,
                     (stringstream *)
                     msg.ss_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
          ColoredPrintf(kRed,"%s",local_38._M_dataplus._M_p);
        }
        else {
          Message::Message((Message *)&local_38);
          poVar3 = (ostream *)(local_38._M_dataplus._M_p + 0x10);
          std::operator<<(poVar3,"Invalid environment variables: you have ");
          std::operator<<(poVar3,"GTEST_TOTAL_SHARDS");
          std::operator<<(poVar3," = ");
          std::ostream::operator<<(poVar3,uVar1);
          std::operator<<(poVar3,", but have left ");
          std::operator<<(poVar3,"GTEST_SHARD_INDEX");
          std::operator<<(poVar3," unset.\n");
          Message::Message(&msg,(Message *)&local_38);
          if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
          }
          StringStreamToString
                    (&local_38,
                     (stringstream *)
                     msg.ss_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
          ColoredPrintf(kRed,"%s",local_38._M_dataplus._M_p);
        }
      }
      else {
        Message::Message((Message *)&local_38);
        poVar3 = (ostream *)(local_38._M_dataplus._M_p + 0x10);
        std::operator<<(poVar3,"Invalid environment variables: you have ");
        std::operator<<(poVar3,"GTEST_SHARD_INDEX");
        std::operator<<(poVar3," = ");
        std::ostream::operator<<(poVar3,uVar2);
        std::operator<<(poVar3,", but have left ");
        std::operator<<(poVar3,"GTEST_TOTAL_SHARDS");
        std::operator<<(poVar3," unset.\n");
        Message::Message(&msg,(Message *)&local_38);
        if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
        }
        StringStreamToString
                  (&local_38,
                   (stringstream *)
                   msg.ss_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
        ColoredPrintf(kRed,"%s",local_38._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&local_38);
      fflush(_stdout);
      exit(1);
    }
  }
  return false;
}

Assistant:

bool ShouldShard(const char* total_shards_env,
                 const char* shard_index_env,
                 bool in_subprocess_for_death_test) {
  if (in_subprocess_for_death_test) {
    return false;
  }

  const int32_t total_shards = Int32FromEnvOrDie(total_shards_env, -1);
  const int32_t shard_index = Int32FromEnvOrDie(shard_index_env, -1);

  if (total_shards == -1 && shard_index == -1) {
    return false;
  } else if (total_shards == -1 && shard_index != -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestShardIndex << " = " << shard_index
      << ", but have left " << kTestTotalShards << " unset.\n";
    ColoredPrintf(GTestColor::kRed, "%s", msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (total_shards != -1 && shard_index == -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestTotalShards << " = " << total_shards
      << ", but have left " << kTestShardIndex << " unset.\n";
    ColoredPrintf(GTestColor::kRed, "%s", msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (shard_index < 0 || shard_index >= total_shards) {
    const Message msg = Message()
      << "Invalid environment variables: we require 0 <= "
      << kTestShardIndex << " < " << kTestTotalShards
      << ", but you have " << kTestShardIndex << "=" << shard_index
      << ", " << kTestTotalShards << "=" << total_shards << ".\n";
    ColoredPrintf(GTestColor::kRed, "%s", msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  }

  return total_shards > 1;
}